

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O3

void PhyloTree::getCommonEdges
               (PhyloTree *t1,PhyloTree *t2,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *dest)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  long lVar1;
  pointer pPVar2;
  pointer pPVar3;
  bool bVar4;
  int originalID;
  ulong uVar5;
  pointer this;
  pointer this_00;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> t2_edges;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> t1_edges;
  int local_114;
  _func_int **local_110;
  vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *local_108;
  double local_100;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_f8;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_d8;
  PhyloTreeEdge local_b8;
  _func_int **local_70;
  double local_68;
  double local_60;
  Bipartition local_58;
  
  local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (PhyloTreeEdge *)0x0;
  local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (PhyloTreeEdge *)0x0;
  local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (PhyloTreeEdge *)0x0;
  local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (PhyloTreeEdge *)0x0;
  local_108 = (vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)dest;
  getEdges(t1,&local_d8);
  getEdges(t2,&local_f8);
  pPVar3 = local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar2 = local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar5 = ((long)local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar2,pPVar3);
  }
  pPVar3 = local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar2 = local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar5 = ((long)local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
               super__Vector_impl_data._M_finish,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar2,pPVar3);
    pPVar3 = local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pPVar2 = local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
        super__Vector_impl_data._M_finish &&
        local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_110 = (_func_int **)&PTR_toString_abi_cxx11__0013ea08;
      local_70 = (_func_int **)&PTR_toString_abi_cxx11__0013eb00;
      this = local_f8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
             super__Vector_impl_data._M_start;
      this_00 = local_d8.super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        a = &(this_00->super_Bipartition).partition;
        b = &(this->super_Bipartition).partition;
        bVar4 = boost::operator<(a,b);
        if (bVar4) {
          bVar4 = PhyloTreeEdge::isCompatibleWith(this_00,&local_f8);
          if (bVar4) {
            PhyloTreeEdge::asSplit(&local_b8.super_Bipartition,this_00);
            local_100 = PhyloTreeEdge::getAttribute(this_00);
            local_114 = PhyloTreeEdge::getOriginalID(this_00);
            std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
            emplace_back<Bipartition,double,int>
                      (local_108,&local_b8.super_Bipartition,&local_100,&local_114);
            local_b8.super_Bipartition._vptr_Bipartition = local_110;
            bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants(&local_b8.super_Bipartition.partition);
            if (!bVar4) goto LAB_001218f6;
            if (local_b8.super_Bipartition.partition.m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b8.super_Bipartition.partition.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          this_00 = this_00 + 1;
        }
        else {
          bVar4 = boost::operator<(b,a);
          if (bVar4) {
            bVar4 = PhyloTreeEdge::isCompatibleWith(this,&local_d8);
            if (bVar4) {
              PhyloTreeEdge::asSplit(&local_b8.super_Bipartition,this);
              local_100 = PhyloTreeEdge::getAttribute(this);
              local_114 = PhyloTreeEdge::getOriginalID(this);
              std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::
              emplace_back<Bipartition,double,int>
                        (local_108,&local_b8.super_Bipartition,&local_100,&local_114);
              local_b8.super_Bipartition._vptr_Bipartition = local_110;
              bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                      m_check_invariants(&local_b8.super_Bipartition.partition);
              if (!bVar4) goto LAB_001218f6;
              if (local_b8.super_Bipartition.partition.m_bits.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_b8.super_Bipartition.partition.m_bits.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
            }
          }
          else {
            PhyloTreeEdge::asSplit(&local_58,this_00);
            local_60 = PhyloTreeEdge::getLength(this_00);
            local_68 = PhyloTreeEdge::getLength(this);
            originalID = PhyloTreeEdge::getOriginalID(this_00);
            PhyloTreeEdge::PhyloTreeEdge(&local_b8,&local_58,local_60 - local_68,originalID);
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::emplace_back<PhyloTreeEdge>
                      ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)local_108,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8);
            local_b8.super_Bipartition._vptr_Bipartition = local_70;
            if (local_b8.originalEdge.super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_b8.originalEdge.
                         super___shared_ptr<Bipartition,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            local_b8.super_Bipartition._vptr_Bipartition = local_110;
            bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants(&local_b8.super_Bipartition.partition);
            if (!bVar4) {
LAB_001218f6:
              __assert_fail("m_check_invariants()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                            ,0x279,
                            "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                           );
            }
            if (local_b8.super_Bipartition.partition.m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b8.super_Bipartition.partition.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            local_58._vptr_Bipartition = local_110;
            bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants(&local_58.partition);
            if (!bVar4) goto LAB_001218f6;
            if (local_58.partition.m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_58.partition.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            this_00 = this_00 + 1;
          }
          this = this + 1;
        }
      } while ((this_00 != pPVar3) && (this != pPVar2));
    }
  }
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_f8);
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector(&local_d8);
  return;
}

Assistant:

void PhyloTree::getCommonEdges(PhyloTree &t1, PhyloTree &t2, vector<PhyloTreeEdge> &dest) {
    vector<PhyloTreeEdge> t1_edges;
    vector<PhyloTreeEdge> t2_edges;
    t1.getEdges(t1_edges);
    t2.getEdges(t2_edges);
    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    auto first1 = t1_edges.begin();
    auto first2 = t2_edges.begin();
    auto last1 = t1_edges.end();
    auto last2 = t2_edges.end();
    auto common_bkinstr = std::back_inserter(dest);

    while (first1 != last1 && first2 != last2) {
        if (*first1 < *first2) {
            if (first1->isCompatibleWith(t2_edges)) {
                dest.emplace_back(first1->asSplit(), first1->getAttribute(), first1->getOriginalID());
            }
            ++first1; // first1 not in list2
        } else {
            if (!(*first2 < *first1)) { // first1 == first2
                *common_bkinstr++ = std::move(PhyloTreeEdge(first1->asSplit(), first1->getLength() - first2->getLength(), first1->getOriginalID()));
                ++first1;
            }
            else { // first2 not in list1
                if (first2->isCompatibleWith(t1_edges)) {
                    dest.emplace_back(first2->asSplit(), first2->getAttribute(), first2->getOriginalID());
                }
            }
            ++first2;
        }
    }
}